

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorConvertHSVtoRGB(float h,float s,float v,float *out_r,float *out_g,float *out_b)

{
  int iVar1;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float t;
  float q;
  float p;
  float f;
  int i;
  
  if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
    fVar2 = fmodf(in_XMM0_Da,1.0);
    iVar1 = (int)(fVar2 / 0.16666667);
    fVar2 = fVar2 / 0.16666667 - (float)iVar1;
    fVar3 = in_XMM2_Da * (1.0 - in_XMM1_Da);
    fVar4 = in_XMM2_Da * (1.0 - in_XMM1_Da * fVar2);
    fVar2 = in_XMM2_Da * (1.0 - in_XMM1_Da * (1.0 - fVar2));
    switch(iVar1) {
    case 0:
      *in_RDI = in_XMM2_Da;
      *in_RSI = fVar2;
      *in_RDX = fVar3;
      break;
    case 1:
      *in_RDI = fVar4;
      *in_RSI = in_XMM2_Da;
      *in_RDX = fVar3;
      break;
    case 2:
      *in_RDI = fVar3;
      *in_RSI = in_XMM2_Da;
      *in_RDX = fVar2;
      break;
    case 3:
      *in_RDI = fVar3;
      *in_RSI = fVar4;
      *in_RDX = in_XMM2_Da;
      break;
    case 4:
      *in_RDI = fVar2;
      *in_RSI = fVar3;
      *in_RDX = in_XMM2_Da;
      break;
    case 5:
    default:
      *in_RDI = in_XMM2_Da;
      *in_RSI = fVar3;
      *in_RDX = fVar4;
    }
  }
  else {
    *in_RDX = in_XMM2_Da;
    *in_RSI = in_XMM2_Da;
    *in_RDI = in_XMM2_Da;
  }
  return;
}

Assistant:

void ImGui::ColorConvertHSVtoRGB(float h, float s, float v, float& out_r, float& out_g, float& out_b)
{
    if (s == 0.0f)
    {
        // gray
        out_r = out_g = out_b = v;
        return;
    }

    h = ImFmod(h, 1.0f) / (60.0f / 360.0f);
    int   i = (int)h;
    float f = h - (float)i;
    float p = v * (1.0f - s);
    float q = v * (1.0f - s * f);
    float t = v * (1.0f - s * (1.0f - f));

    switch (i)
    {
    case 0: out_r = v; out_g = t; out_b = p; break;
    case 1: out_r = q; out_g = v; out_b = p; break;
    case 2: out_r = p; out_g = v; out_b = t; break;
    case 3: out_r = p; out_g = q; out_b = v; break;
    case 4: out_r = t; out_g = p; out_b = v; break;
    case 5: default: out_r = v; out_g = p; out_b = q; break;
    }
}